

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_both.cc
# Opt level: O0

bool bssl::tls_can_accept_handshake_data(SSL *ssl,uint8_t *out_alert)

{
  bool bVar1;
  size_t sVar2;
  ulong local_50;
  size_t bytes_needed;
  SSLMessage msg;
  uint8_t *out_alert_local;
  SSL *ssl_local;
  
  msg.raw.len = (size_t)out_alert;
  bVar1 = parse_message(ssl,(SSLMessage *)&bytes_needed,&local_50);
  if (bVar1) {
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_both.cc"
                  ,0x1a7);
    *(undefined1 *)msg.raw.len = 0x50;
    ssl_local._7_1_ = false;
  }
  else {
    sVar2 = ssl_max_handshake_message_len(ssl);
    if (sVar2 + 4 < local_50) {
      ERR_put_error(0x10,0,0x96,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_both.cc"
                    ,0x1ae);
      *(undefined1 *)msg.raw.len = 0x2f;
      ssl_local._7_1_ = false;
    }
    else {
      ssl_local._7_1_ = true;
    }
  }
  return ssl_local._7_1_;
}

Assistant:

bool tls_can_accept_handshake_data(const SSL *ssl, uint8_t *out_alert) {
  // If there is a complete message, the caller must have consumed it first.
  SSLMessage msg;
  size_t bytes_needed;
  if (parse_message(ssl, &msg, &bytes_needed)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return false;
  }

  // Enforce the limit so the peer cannot force us to buffer 16MB.
  if (bytes_needed > 4 + ssl_max_handshake_message_len(ssl)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_EXCESSIVE_MESSAGE_SIZE);
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }

  return true;
}